

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsu.c
# Opt level: O2

void device_reset_vsu(void *info)

{
  long lVar1;
  vsu_state *chip;
  
  *(undefined1 *)((long)info + 0x38) = 0;
  *(undefined4 *)((long)info + 0x194) = 0;
  *(undefined4 *)((long)info + 0x1e0) = 1;
  for (lVar1 = 300; lVar1 != 0x132; lVar1 = lVar1 + 1) {
    *(undefined1 *)((long)info + lVar1 + -0x124) = 0;
    *(undefined1 *)((long)info + lVar1 + -0x11e) = 0;
    *(undefined1 *)((long)info + lVar1 + -0x118) = 0;
    *(undefined2 *)((long)info + lVar1 * 2 + -0x23e) = 0;
    *(undefined2 *)((long)info + lVar1 * 2 + -0x232) = 0;
    *(undefined1 *)((long)info + lVar1 + -0xfa) = 0;
    *(undefined4 *)((long)info + lVar1 * 4 + -0x3b4) = 0;
    *(undefined4 *)((long)info + lVar1 * 4 + -0x39c) = 0;
    *(undefined1 *)((long)info + lVar1) = 0;
    *(undefined4 *)((long)info + lVar1 * 4 + -0x364) = 0;
    *(undefined4 *)((long)info + lVar1 * 4 + -0x34c) = 0;
    *(undefined4 *)((long)info + lVar1 * 4 + -0x334) = 0;
    *(undefined4 *)((long)info + lVar1 * 4 + -0x318) = 0x12c0;
    *(undefined4 *)((long)info + lVar1 * 4 + -0x300) = 4;
    *(undefined4 *)((long)info + lVar1 * 4 + -0x2e8) = 4;
    *(undefined4 *)((long)info + lVar1 * 4 + -0x37c) = 0x78;
  }
  *(undefined4 *)((long)info + 0x1e4) = 0x78;
  *(undefined1 *)((long)info + 0x1e8) = 0;
  *(undefined8 *)((long)info + 0x200) = 0;
  memset((void *)((long)info + 0x39),0,0xc0);
  return;
}

Assistant:

static void VSU_Power(vsu_state* chip)
{
	int ch;
	
	chip->SweepControl = 0;
	chip->SweepModCounter = 0;
	chip->SweepModClockDivider = 1;

	for(ch = 0; ch < 6; ch++)
	{
		chip->IntlControl[ch] = 0;
		chip->LeftLevel[ch] = 0;
		chip->RightLevel[ch] = 0;
		chip->Frequency[ch] = 0;
		chip->EnvControl[ch] = 0;
		chip->RAMAddress[ch] = 0;

		chip->EffFreq[ch] = 0;
		chip->Envelope[ch] = 0;
		chip->WavePos[ch] = 0;
		chip->FreqCounter[ch] = 0;
		chip->IntervalCounter[ch] = 0;
		chip->EnvelopeCounter[ch] = 0;

		chip->EffectsClockDivider[ch] = 4800;
		chip->IntervalClockDivider[ch] = 4;
		chip->EnvelopeClockDivider[ch] = 4;

		chip->LatcherClockDivider[ch] = 120;
	}


	chip->NoiseLatcherClockDivider = 120;
	chip->NoiseLatcher = 0;

	memset(chip->WaveData, 0, sizeof(chip->WaveData));
	memset(chip->ModData, 0, sizeof(chip->ModData));

	RC_RESET(&chip->cycleCntr);
}